

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_pack8.h
# Opt level: O3

void ncnn::convdw3x3s2_pack8_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  void **ppvVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  void *pvVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  int iVar259;
  long lVar260;
  float *pfVar261;
  int iVar262;
  uint uVar263;
  float *pfVar264;
  int iVar265;
  long lVar266;
  uint uVar267;
  long lVar268;
  float *pfVar269;
  float *pfVar270;
  float in_register_0000121c;
  float in_register_0000125c;
  float fVar271;
  float fVar272;
  float fVar273;
  float in_register_0000129c;
  float fVar274;
  float in_register_000012dc;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  float in_register_0000135c;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  
  iVar12 = bottom_blob->c;
  if (0 < (long)iVar12) {
    uVar13 = top_blob->w;
    iVar14 = top_blob->h;
    iVar259 = (bottom_blob->w - uVar13) * 0x10;
    lVar266 = 0;
    do {
      if (_bias == (Mat *)0x0) {
        fVar279 = 0.0;
        fVar280 = 0.0;
        fVar281 = 0.0;
        fVar282 = 0.0;
        fVar283 = 0.0;
        fVar284 = 0.0;
        fVar285 = 0.0;
        fVar286 = 0.0;
      }
      else {
        ppvVar1 = &_bias->data + lVar266 * 4;
        fVar279 = *(float *)ppvVar1;
        fVar280 = *(float *)((long)ppvVar1 + 4);
        fVar281 = *(float *)(ppvVar1 + 1);
        fVar282 = *(float *)((long)ppvVar1 + 0xc);
        fVar283 = *(float *)(ppvVar1 + 2);
        fVar284 = *(float *)((long)ppvVar1 + 0x14);
        fVar285 = *(float *)(ppvVar1 + 3);
        fVar286 = *(float *)((long)ppvVar1 + 0x1c);
      }
      if (0 < iVar14) {
        pfVar269 = (float *)(top_blob->cstep * lVar266 * top_blob->elemsize + (long)top_blob->data);
        lVar260 = kernel->w * lVar266 * kernel->elemsize;
        pvVar15 = kernel->data;
        pfVar261 = (float *)((long)pvVar15 + lVar260);
        fVar191 = *pfVar261;
        fVar192 = pfVar261[1];
        fVar193 = pfVar261[2];
        fVar194 = pfVar261[3];
        fVar195 = pfVar261[4];
        fVar196 = pfVar261[5];
        fVar197 = pfVar261[6];
        pfVar261 = (float *)((long)pvVar15 + lVar260 + 0x20);
        fVar198 = *pfVar261;
        fVar199 = pfVar261[1];
        fVar200 = pfVar261[2];
        fVar201 = pfVar261[3];
        fVar202 = pfVar261[4];
        fVar203 = pfVar261[5];
        fVar204 = pfVar261[6];
        fVar205 = pfVar261[7];
        pfVar261 = (float *)((long)pvVar15 + lVar260 + 0x40);
        fVar206 = *pfVar261;
        fVar207 = pfVar261[1];
        fVar208 = pfVar261[2];
        fVar209 = pfVar261[3];
        fVar210 = pfVar261[4];
        fVar211 = pfVar261[5];
        fVar212 = pfVar261[6];
        pfVar261 = (float *)((long)pvVar15 + lVar260 + 0x60);
        fVar227 = *pfVar261;
        fVar228 = pfVar261[1];
        fVar229 = pfVar261[2];
        fVar230 = pfVar261[3];
        fVar231 = pfVar261[4];
        fVar232 = pfVar261[5];
        fVar233 = pfVar261[6];
        fVar234 = pfVar261[7];
        pfVar261 = (float *)((long)pvVar15 + lVar260 + 0x80);
        fVar220 = *pfVar261;
        fVar221 = pfVar261[1];
        fVar222 = pfVar261[2];
        fVar223 = pfVar261[3];
        fVar224 = pfVar261[4];
        fVar225 = pfVar261[5];
        fVar226 = pfVar261[6];
        pfVar261 = (float *)((long)pvVar15 + lVar260 + 0xa0);
        fVar213 = *pfVar261;
        fVar214 = pfVar261[1];
        fVar215 = pfVar261[2];
        fVar216 = pfVar261[3];
        fVar217 = pfVar261[4];
        fVar218 = pfVar261[5];
        fVar219 = pfVar261[6];
        pfVar261 = (float *)((long)pvVar15 + lVar260 + 0xc0);
        fVar235 = *pfVar261;
        fVar236 = pfVar261[1];
        fVar237 = pfVar261[2];
        fVar238 = pfVar261[3];
        fVar239 = pfVar261[4];
        fVar240 = pfVar261[5];
        fVar241 = pfVar261[6];
        fVar242 = pfVar261[7];
        pfVar261 = (float *)((long)pvVar15 + lVar260 + 0xe0);
        fVar243 = *pfVar261;
        fVar244 = pfVar261[1];
        fVar245 = pfVar261[2];
        fVar246 = pfVar261[3];
        fVar247 = pfVar261[4];
        fVar248 = pfVar261[5];
        fVar249 = pfVar261[6];
        fVar250 = pfVar261[7];
        pfVar261 = (float *)((long)pvVar15 + lVar260 + 0x100);
        fVar251 = *pfVar261;
        fVar252 = pfVar261[1];
        fVar253 = pfVar261[2];
        fVar254 = pfVar261[3];
        fVar255 = pfVar261[4];
        fVar256 = pfVar261[5];
        fVar257 = pfVar261[6];
        fVar258 = pfVar261[7];
        pfVar270 = (float *)(bottom_blob->cstep * lVar266 * bottom_blob->elemsize +
                            (long)bottom_blob->data);
        lVar260 = (long)bottom_blob->w * bottom_blob->elemsize;
        pfVar264 = (float *)(lVar260 * 2 + (long)pfVar270);
        pfVar261 = (float *)(lVar260 + (long)pfVar270);
        iVar265 = 0;
        do {
          if ((int)uVar13 < 4) {
            uVar267 = 0;
          }
          else {
            iVar262 = 3;
            fVar288 = fVar242;
            fVar291 = fVar250;
            do {
              fVar16 = pfVar270[0x10];
              fVar17 = pfVar270[0x11];
              fVar18 = pfVar270[0x12];
              fVar19 = pfVar270[0x13];
              fVar20 = pfVar270[0x14];
              fVar21 = pfVar270[0x15];
              fVar22 = pfVar270[0x16];
              fVar23 = pfVar270[0x17];
              fVar24 = pfVar270[0x20];
              fVar25 = pfVar270[0x21];
              fVar26 = pfVar270[0x22];
              fVar27 = pfVar270[0x23];
              fVar28 = pfVar270[0x24];
              fVar29 = pfVar270[0x25];
              fVar30 = pfVar270[0x26];
              fVar31 = pfVar270[0x30];
              fVar32 = pfVar270[0x31];
              fVar33 = pfVar270[0x32];
              fVar34 = pfVar270[0x33];
              fVar35 = pfVar270[0x34];
              fVar36 = pfVar270[0x35];
              fVar37 = pfVar270[0x36];
              fVar38 = pfVar270[1];
              fVar39 = pfVar270[2];
              fVar40 = pfVar270[3];
              fVar41 = pfVar270[4];
              fVar42 = pfVar270[5];
              fVar43 = pfVar270[6];
              fVar287 = fVar288 + fVar286;
              fVar289 = fVar291 + fVar286;
              fVar292 = fVar258 + fVar286;
              fVar44 = pfVar270[9];
              fVar45 = pfVar270[10];
              fVar46 = pfVar270[0xb];
              fVar47 = pfVar270[0xc];
              fVar48 = pfVar270[0xd];
              fVar49 = pfVar270[0xe];
              fVar50 = pfVar270[0x18];
              fVar51 = pfVar270[0x19];
              fVar52 = pfVar270[0x1a];
              fVar53 = pfVar270[0x1b];
              fVar54 = pfVar270[0x1c];
              fVar55 = pfVar270[0x1d];
              fVar56 = pfVar270[0x1e];
              fVar57 = pfVar270[0x28];
              fVar58 = pfVar270[0x29];
              fVar59 = pfVar270[0x2a];
              fVar60 = pfVar270[0x2b];
              fVar61 = pfVar270[0x2c];
              fVar62 = pfVar270[0x2d];
              fVar63 = pfVar270[0x2e];
              fVar64 = pfVar270[0x38];
              fVar65 = pfVar270[0x39];
              fVar66 = pfVar270[0x3a];
              fVar67 = pfVar270[0x3b];
              fVar272 = pfVar270[0x3c];
              fVar273 = pfVar270[0x3d];
              fVar68 = pfVar270[0x3e];
              fVar69 = pfVar270[0x40];
              fVar70 = pfVar270[0x41];
              fVar71 = pfVar270[0x42];
              fVar72 = pfVar270[0x43];
              fVar73 = pfVar270[0x44];
              fVar74 = pfVar270[0x45];
              fVar75 = pfVar270[0x46];
              fVar76 = pfVar261[0x10];
              fVar77 = pfVar261[0x11];
              fVar78 = pfVar261[0x12];
              fVar79 = pfVar261[0x13];
              fVar80 = pfVar261[0x14];
              fVar81 = pfVar261[0x15];
              fVar82 = pfVar261[0x16];
              fVar83 = pfVar261[0x20];
              fVar84 = pfVar261[0x21];
              fVar85 = pfVar261[0x22];
              fVar86 = pfVar261[0x23];
              fVar87 = pfVar261[0x24];
              fVar88 = pfVar261[0x25];
              fVar89 = pfVar261[0x26];
              fVar90 = pfVar261[1];
              fVar91 = pfVar261[2];
              fVar92 = pfVar261[3];
              fVar93 = pfVar261[4];
              fVar94 = pfVar261[5];
              fVar95 = pfVar261[6];
              fVar96 = pfVar261[0x30];
              fVar97 = pfVar261[0x31];
              fVar98 = pfVar261[0x32];
              fVar99 = pfVar261[0x33];
              fVar100 = pfVar261[0x34];
              fVar101 = pfVar261[0x35];
              fVar102 = pfVar261[0x36];
              fVar103 = pfVar261[9];
              fVar104 = pfVar261[10];
              fVar105 = pfVar261[0xb];
              fVar106 = pfVar261[0xc];
              fVar107 = pfVar261[0xd];
              fVar108 = pfVar261[0xe];
              fVar109 = pfVar261[0x18];
              fVar110 = pfVar261[0x19];
              fVar111 = pfVar261[0x1a];
              fVar112 = pfVar261[0x1b];
              fVar113 = pfVar261[0x1c];
              fVar114 = pfVar261[0x1d];
              fVar271 = pfVar261[0x1e];
              fVar288 = fVar287 + fVar289;
              fVar274 = pfVar261[0x28];
              fVar115 = pfVar261[0x29];
              fVar116 = pfVar261[0x2a];
              fVar117 = pfVar261[0x2b];
              fVar118 = pfVar261[0x2c];
              fVar119 = pfVar261[0x2d];
              fVar120 = pfVar261[0x2e];
              fVar290 = fVar292 + fVar289;
              fVar121 = pfVar261[0x38];
              fVar122 = pfVar261[0x39];
              fVar123 = pfVar261[0x3a];
              fVar124 = pfVar261[0x3b];
              fVar125 = pfVar261[0x3c];
              fVar126 = pfVar261[0x3d];
              fVar127 = pfVar261[0x3e];
              fVar275 = pfVar270[0x27] + fVar289 + pfVar261[0x17];
              fVar276 = fVar288 + fVar275;
              fVar277 = fVar290 + fVar276;
              fVar128 = pfVar261[0x40];
              fVar129 = pfVar261[0x41];
              fVar130 = pfVar261[0x42];
              fVar131 = pfVar261[0x43];
              fVar132 = pfVar261[0x44];
              fVar133 = pfVar261[0x45];
              fVar134 = pfVar261[0x46];
              fVar135 = pfVar264[0x10];
              fVar136 = pfVar264[0x11];
              fVar137 = pfVar264[0x12];
              fVar138 = pfVar264[0x13];
              fVar139 = pfVar264[0x14];
              fVar140 = pfVar264[0x15];
              fVar141 = pfVar264[0x16];
              fVar184 = pfVar264[0x20];
              fVar185 = pfVar264[0x21];
              fVar186 = pfVar264[0x22];
              fVar187 = pfVar264[0x23];
              fVar188 = pfVar264[0x24];
              fVar189 = pfVar264[0x25];
              fVar190 = pfVar264[0x26];
              in_register_0000135c = pfVar264[0x27];
              fVar142 = pfVar264[0x30];
              fVar143 = pfVar264[0x31];
              fVar144 = pfVar264[0x32];
              fVar145 = pfVar264[0x33];
              fVar146 = pfVar264[0x34];
              fVar147 = pfVar264[0x35];
              fVar148 = pfVar264[0x36];
              fVar149 = pfVar264[1];
              fVar150 = pfVar264[2];
              fVar151 = pfVar264[3];
              fVar152 = pfVar264[4];
              fVar153 = pfVar264[5];
              fVar154 = pfVar264[6];
              fVar155 = pfVar264[9];
              fVar156 = pfVar264[10];
              fVar157 = pfVar264[0xb];
              fVar158 = pfVar264[0xc];
              fVar159 = pfVar264[0xd];
              fVar160 = pfVar264[0xe];
              fVar161 = pfVar264[0x18];
              fVar162 = pfVar264[0x19];
              fVar163 = pfVar264[0x1a];
              fVar164 = pfVar264[0x1b];
              fVar165 = pfVar264[0x1c];
              fVar166 = pfVar264[0x1d];
              fVar167 = pfVar264[0x1e];
              fVar168 = pfVar264[0x28];
              fVar169 = pfVar264[0x29];
              fVar170 = pfVar264[0x2a];
              fVar171 = pfVar264[0x2b];
              fVar172 = pfVar264[0x2c];
              fVar173 = pfVar264[0x2d];
              fVar174 = pfVar264[0x2e];
              fVar288 = fVar288 + fVar290;
              fVar175 = pfVar264[0x38];
              fVar176 = pfVar264[0x39];
              fVar177 = pfVar264[0x3a];
              fVar178 = pfVar264[0x3b];
              fVar179 = pfVar264[0x3c];
              fVar180 = pfVar264[0x3d];
              fVar181 = pfVar264[0x3e];
              fVar291 = fVar292 + fVar290;
              fVar278 = pfVar270[0x27] + fVar289 + fVar290 + pfVar264[0x17];
              in_register_0000125c = fVar287 + fVar23 + in_register_0000125c + fVar275 + fVar278;
              fVar278 = pfVar261[0x37] + fVar292 + fVar278;
              in_register_0000129c = fVar289 + fVar23 + in_register_0000129c + fVar276 + fVar278;
              fVar278 = fVar288 + fVar278;
              in_register_000012dc = fVar292 + fVar23 + in_register_000012dc + fVar277 + fVar278;
              fVar275 = pfVar264[0x40];
              fVar276 = pfVar264[0x41];
              fVar287 = pfVar264[0x42];
              fVar289 = pfVar264[0x43];
              fVar290 = pfVar264[0x44];
              fVar182 = pfVar264[0x45];
              fVar183 = pfVar264[0x46];
              in_register_0000121c =
                   in_register_0000121c + fVar286 + fVar23 + fVar205 + fVar292 + fVar234 + fVar277 +
                   fVar291 + fVar278;
              *pfVar269 = fVar191 * *pfVar270 + fVar279 + fVar16 * fVar206 + fVar198 * pfVar270[8] +
                          fVar227 * *pfVar261 + fVar220 * pfVar261[8] + fVar213 * fVar76 +
                          fVar235 * *pfVar264 + fVar243 * pfVar264[8] + fVar251 * fVar135;
              pfVar269[1] = fVar192 * fVar38 + fVar280 + fVar17 * fVar207 + fVar199 * fVar44 +
                            fVar228 * fVar90 + fVar221 * fVar103 + fVar214 * fVar77 +
                            fVar236 * fVar149 + fVar244 * fVar155 + fVar252 * fVar136;
              pfVar269[2] = fVar193 * fVar39 + fVar281 + fVar18 * fVar208 + fVar200 * fVar45 +
                            fVar229 * fVar91 + fVar222 * fVar104 + fVar215 * fVar78 +
                            fVar237 * fVar150 + fVar245 * fVar156 + fVar253 * fVar137;
              pfVar269[3] = fVar194 * fVar40 + fVar282 + fVar19 * fVar209 + fVar201 * fVar46 +
                            fVar230 * fVar92 + fVar223 * fVar105 + fVar216 * fVar79 +
                            fVar238 * fVar151 + fVar246 * fVar157 + fVar254 * fVar138;
              pfVar269[4] = fVar195 * fVar41 + fVar283 + fVar20 * fVar210 + fVar202 * fVar47 +
                            fVar231 * fVar93 + fVar224 * fVar106 + fVar217 * fVar80 +
                            fVar239 * fVar152 + fVar247 * fVar158 + fVar255 * fVar139;
              pfVar269[5] = fVar196 * fVar42 + fVar284 + fVar21 * fVar211 + fVar203 * fVar48 +
                            fVar232 * fVar94 + fVar225 * fVar107 + fVar218 * fVar81 +
                            fVar240 * fVar153 + fVar248 * fVar159 + fVar256 * fVar140;
              pfVar269[6] = fVar197 * fVar43 + fVar285 + fVar22 * fVar212 + fVar204 * fVar49 +
                            fVar233 * fVar95 + fVar226 * fVar108 + fVar219 * fVar82 +
                            fVar241 * fVar154 + fVar249 * fVar160 + fVar257 * fVar141;
              pfVar269[7] = in_register_0000125c;
              pfVar269[8] = fVar16 * fVar191 + fVar279 + fVar24 * fVar206 + fVar198 * fVar50 +
                            fVar76 * fVar227 + fVar220 * fVar109 + fVar83 * fVar213 +
                            fVar235 * fVar135 + fVar243 * fVar161 + fVar251 * fVar184;
              pfVar269[9] = fVar17 * fVar192 + fVar280 + fVar25 * fVar207 + fVar199 * fVar51 +
                            fVar77 * fVar228 + fVar221 * fVar110 + fVar84 * fVar214 +
                            fVar236 * fVar136 + fVar244 * fVar162 + fVar252 * fVar185;
              pfVar269[10] = fVar18 * fVar193 + fVar281 + fVar26 * fVar208 + fVar200 * fVar52 +
                             fVar78 * fVar229 + fVar222 * fVar111 + fVar85 * fVar215 +
                             fVar237 * fVar137 + fVar245 * fVar163 + fVar253 * fVar186;
              pfVar269[0xb] =
                   fVar19 * fVar194 + fVar282 + fVar27 * fVar209 + fVar201 * fVar53 +
                   fVar79 * fVar230 + fVar223 * fVar112 + fVar86 * fVar216 +
                   fVar238 * fVar138 + fVar246 * fVar164 + fVar254 * fVar187;
              pfVar269[0xc] =
                   fVar20 * fVar195 + fVar283 + fVar28 * fVar210 + fVar202 * fVar54 +
                   fVar80 * fVar231 + fVar224 * fVar113 + fVar87 * fVar217 +
                   fVar239 * fVar139 + fVar247 * fVar165 + fVar255 * fVar188;
              pfVar269[0xd] =
                   fVar21 * fVar196 + fVar284 + fVar29 * fVar211 + fVar203 * fVar55 +
                   fVar81 * fVar232 + fVar225 * fVar114 + fVar88 * fVar218 +
                   fVar240 * fVar140 + fVar248 * fVar166 + fVar256 * fVar189;
              pfVar269[0xe] =
                   fVar22 * fVar197 + fVar285 + fVar30 * fVar212 + fVar204 * fVar56 +
                   fVar82 * fVar233 + fVar226 * fVar271 + fVar89 * fVar219 +
                   fVar241 * fVar141 + fVar249 * fVar167 + fVar257 * fVar190;
              pfVar269[0xf] = in_register_0000129c;
              pfVar269[0x10] =
                   fVar24 * fVar191 + fVar279 + fVar31 * fVar206 + fVar198 * fVar57 +
                   fVar83 * fVar227 + fVar220 * fVar274 + fVar96 * fVar213 +
                   fVar235 * fVar184 + fVar243 * fVar168 + fVar142 * fVar251;
              pfVar269[0x11] =
                   fVar25 * fVar192 + fVar280 + fVar32 * fVar207 + fVar199 * fVar58 +
                   fVar84 * fVar228 + fVar221 * fVar115 + fVar97 * fVar214 +
                   fVar236 * fVar185 + fVar244 * fVar169 + fVar143 * fVar252;
              pfVar269[0x12] =
                   fVar26 * fVar193 + fVar281 + fVar33 * fVar208 + fVar200 * fVar59 +
                   fVar85 * fVar229 + fVar222 * fVar116 + fVar98 * fVar215 +
                   fVar237 * fVar186 + fVar245 * fVar170 + fVar144 * fVar253;
              pfVar269[0x13] =
                   fVar27 * fVar194 + fVar282 + fVar34 * fVar209 + fVar201 * fVar60 +
                   fVar86 * fVar230 + fVar223 * fVar117 + fVar99 * fVar216 +
                   fVar238 * fVar187 + fVar246 * fVar171 + fVar145 * fVar254;
              pfVar269[0x14] =
                   fVar28 * fVar195 + fVar283 + fVar35 * fVar210 + fVar202 * fVar61 +
                   fVar87 * fVar231 + fVar224 * fVar118 + fVar100 * fVar217 +
                   fVar239 * fVar188 + fVar247 * fVar172 + fVar146 * fVar255;
              pfVar269[0x15] =
                   fVar29 * fVar196 + fVar284 + fVar36 * fVar211 + fVar203 * fVar62 +
                   fVar88 * fVar232 + fVar225 * fVar119 + fVar101 * fVar218 +
                   fVar240 * fVar189 + fVar248 * fVar173 + fVar147 * fVar256;
              pfVar269[0x16] =
                   fVar30 * fVar197 + fVar285 + fVar37 * fVar212 + fVar204 * fVar63 +
                   fVar89 * fVar233 + fVar226 * fVar120 + fVar102 * fVar219 +
                   fVar241 * fVar190 + fVar249 * fVar174 + fVar148 * fVar257;
              pfVar269[0x17] = in_register_000012dc;
              pfVar269[0x18] =
                   fVar31 * fVar191 + fVar279 + fVar206 * fVar69 + fVar198 * fVar64 +
                   fVar220 * fVar121 + fVar96 * fVar227 + fVar213 * fVar128 +
                   fVar142 * fVar235 + fVar243 * fVar175 + fVar251 * fVar275;
              pfVar269[0x19] =
                   fVar32 * fVar192 + fVar280 + fVar207 * fVar70 + fVar199 * fVar65 +
                   fVar221 * fVar122 + fVar97 * fVar228 + fVar214 * fVar129 +
                   fVar143 * fVar236 + fVar244 * fVar176 + fVar252 * fVar276;
              pfVar269[0x1a] =
                   fVar33 * fVar193 + fVar281 + fVar208 * fVar71 + fVar200 * fVar66 +
                   fVar222 * fVar123 + fVar98 * fVar229 + fVar215 * fVar130 +
                   fVar144 * fVar237 + fVar245 * fVar177 + fVar253 * fVar287;
              pfVar269[0x1b] =
                   fVar34 * fVar194 + fVar282 + fVar209 * fVar72 + fVar201 * fVar67 +
                   fVar223 * fVar124 + fVar99 * fVar230 + fVar216 * fVar131 +
                   fVar145 * fVar238 + fVar246 * fVar178 + fVar254 * fVar289;
              pfVar269[0x1c] =
                   fVar35 * fVar195 + fVar283 + fVar210 * fVar73 + fVar202 * fVar272 +
                   fVar224 * fVar125 + fVar100 * fVar231 + fVar217 * fVar132 +
                   fVar146 * fVar239 + fVar247 * fVar179 + fVar255 * fVar290;
              pfVar269[0x1d] =
                   fVar36 * fVar196 + fVar284 + fVar211 * fVar74 + fVar203 * fVar273 +
                   fVar225 * fVar126 + fVar101 * fVar232 + fVar218 * fVar133 +
                   fVar147 * fVar240 + fVar248 * fVar180 + fVar256 * fVar182;
              pfVar269[0x1e] =
                   fVar37 * fVar197 + fVar285 + fVar212 * fVar75 + fVar204 * fVar68 +
                   fVar226 * fVar127 + fVar102 * fVar233 + fVar219 * fVar134 +
                   fVar148 * fVar241 + fVar249 * fVar181 + fVar257 * fVar183;
              pfVar269[0x1f] = in_register_0000121c;
              pfVar270 = pfVar270 + 0x40;
              pfVar261 = pfVar261 + 0x40;
              pfVar264 = pfVar264 + 0x40;
              pfVar269 = pfVar269 + 0x20;
              iVar262 = iVar262 + 4;
              uVar267 = uVar13 & 0xfffffffc;
            } while (iVar262 < (int)uVar13);
          }
          uVar263 = uVar267 | 1;
          while ((int)uVar263 < (int)uVar13) {
            fVar288 = *pfVar270;
            fVar291 = pfVar270[1];
            fVar16 = pfVar270[2];
            fVar17 = pfVar270[3];
            fVar18 = pfVar270[4];
            fVar19 = pfVar270[5];
            fVar20 = pfVar270[6];
            pfVar2 = pfVar270 + 8;
            fVar21 = pfVar270[9];
            fVar22 = pfVar270[10];
            fVar23 = pfVar270[0xb];
            fVar24 = pfVar270[0xc];
            fVar25 = pfVar270[0xd];
            fVar26 = pfVar270[0xe];
            fVar27 = pfVar270[0x18];
            fVar28 = pfVar270[0x19];
            fVar29 = pfVar270[0x1a];
            fVar30 = pfVar270[0x1b];
            fVar31 = pfVar270[0x1c];
            fVar32 = pfVar270[0x1d];
            fVar33 = pfVar270[0x1e];
            fVar34 = pfVar270[0x20];
            fVar35 = pfVar270[0x21];
            fVar36 = pfVar270[0x22];
            fVar37 = pfVar270[0x23];
            fVar38 = pfVar270[0x24];
            fVar39 = pfVar270[0x25];
            fVar40 = pfVar270[0x26];
            fVar41 = pfVar270[0x10];
            fVar42 = pfVar270[0x11];
            fVar43 = pfVar270[0x12];
            fVar44 = pfVar270[0x13];
            fVar45 = pfVar270[0x14];
            fVar46 = pfVar270[0x15];
            fVar47 = pfVar270[0x16];
            pfVar5 = pfVar270 + 0x17;
            pfVar270 = pfVar270 + 0x20;
            in_register_0000135c = fVar286 + in_register_0000135c;
            fVar271 = in_register_0000129c + in_register_000012dc;
            fVar48 = *pfVar261;
            fVar49 = pfVar261[1];
            fVar50 = pfVar261[2];
            fVar51 = pfVar261[3];
            fVar52 = pfVar261[4];
            fVar53 = pfVar261[5];
            fVar54 = pfVar261[6];
            fVar55 = pfVar261[0x10];
            fVar56 = pfVar261[0x11];
            fVar57 = pfVar261[0x12];
            fVar58 = pfVar261[0x13];
            fVar59 = pfVar261[0x14];
            fVar60 = pfVar261[0x15];
            fVar61 = pfVar261[0x16];
            fVar62 = pfVar261[0x17];
            pfVar3 = pfVar261 + 8;
            fVar63 = pfVar261[9];
            fVar64 = pfVar261[10];
            fVar65 = pfVar261[0xb];
            fVar66 = pfVar261[0xc];
            fVar67 = pfVar261[0xd];
            fVar272 = pfVar261[0xe];
            fVar273 = pfVar261[0x18];
            fVar68 = pfVar261[0x19];
            fVar69 = pfVar261[0x1a];
            fVar70 = pfVar261[0x1b];
            fVar71 = pfVar261[0x1c];
            fVar72 = pfVar261[0x1d];
            fVar73 = pfVar261[0x1e];
            fVar74 = pfVar261[0x20];
            fVar75 = pfVar261[0x21];
            fVar76 = pfVar261[0x22];
            fVar77 = pfVar261[0x23];
            fVar78 = pfVar261[0x24];
            fVar79 = pfVar261[0x25];
            fVar80 = pfVar261[0x26];
            pfVar261 = pfVar261 + 0x20;
            fVar274 = *pfVar5 + in_register_0000135c + in_register_0000135c;
            fVar81 = *pfVar264;
            fVar82 = pfVar264[1];
            fVar83 = pfVar264[2];
            fVar84 = pfVar264[3];
            fVar85 = pfVar264[4];
            fVar86 = pfVar264[5];
            fVar87 = pfVar264[6];
            pfVar4 = pfVar264 + 8;
            fVar88 = pfVar264[9];
            fVar89 = pfVar264[10];
            fVar90 = pfVar264[0xb];
            fVar91 = pfVar264[0xc];
            fVar92 = pfVar264[0xd];
            fVar93 = pfVar264[0xe];
            fVar94 = pfVar264[0x10];
            fVar95 = pfVar264[0x11];
            fVar96 = pfVar264[0x12];
            fVar97 = pfVar264[0x13];
            fVar98 = pfVar264[0x14];
            fVar99 = pfVar264[0x15];
            fVar100 = pfVar264[0x16];
            pfVar6 = pfVar264 + 0x17;
            fVar101 = pfVar264[0x18];
            fVar102 = pfVar264[0x19];
            fVar103 = pfVar264[0x1a];
            fVar104 = pfVar264[0x1b];
            fVar105 = pfVar264[0x1c];
            fVar106 = pfVar264[0x1d];
            fVar107 = pfVar264[0x1e];
            in_register_000012dc = in_register_0000135c + fVar62;
            fVar108 = pfVar264[0x20];
            fVar109 = pfVar264[0x21];
            fVar110 = pfVar264[0x22];
            fVar111 = pfVar264[0x23];
            fVar112 = pfVar264[0x24];
            fVar113 = pfVar264[0x25];
            fVar114 = pfVar264[0x26];
            pfVar264 = pfVar264 + 0x20;
            in_register_0000121c =
                 fVar286 + in_register_0000121c + in_register_0000125c + *pfVar5 +
                 in_register_0000129c + in_register_0000135c + fVar62 + fVar274 + fVar62 + *pfVar6;
            in_register_0000129c = in_register_000012dc + in_register_0000135c;
            in_register_0000125c = in_register_0000135c + fVar271 + fVar274 + in_register_0000129c;
            *pfVar269 = fVar279 + fVar191 * fVar288 + fVar198 * *pfVar2 + fVar206 * fVar41 +
                        fVar227 * fVar48 + fVar220 * *pfVar3 + fVar213 * fVar55 +
                        fVar235 * fVar81 + fVar243 * *pfVar4 + fVar251 * fVar94;
            pfVar269[1] = fVar280 + fVar192 * fVar291 + fVar199 * fVar21 + fVar207 * fVar42 +
                          fVar228 * fVar49 + fVar221 * fVar63 + fVar214 * fVar56 +
                          fVar236 * fVar82 + fVar244 * fVar88 + fVar252 * fVar95;
            pfVar269[2] = fVar281 + fVar193 * fVar16 + fVar200 * fVar22 + fVar208 * fVar43 +
                          fVar229 * fVar50 + fVar222 * fVar64 + fVar215 * fVar57 +
                          fVar237 * fVar83 + fVar245 * fVar89 + fVar253 * fVar96;
            pfVar269[3] = fVar282 + fVar194 * fVar17 + fVar201 * fVar23 + fVar209 * fVar44 +
                          fVar230 * fVar51 + fVar223 * fVar65 + fVar216 * fVar58 +
                          fVar238 * fVar84 + fVar246 * fVar90 + fVar254 * fVar97;
            pfVar269[4] = fVar283 + fVar195 * fVar18 + fVar202 * fVar24 + fVar210 * fVar45 +
                          fVar231 * fVar52 + fVar224 * fVar66 + fVar217 * fVar59 +
                          fVar239 * fVar85 + fVar247 * fVar91 + fVar255 * fVar98;
            pfVar269[5] = fVar284 + fVar196 * fVar19 + fVar203 * fVar25 + fVar211 * fVar46 +
                          fVar232 * fVar53 + fVar225 * fVar67 + fVar218 * fVar60 +
                          fVar240 * fVar86 + fVar248 * fVar92 + fVar256 * fVar99;
            pfVar269[6] = fVar285 + fVar197 * fVar20 + fVar204 * fVar26 + fVar212 * fVar47 +
                          fVar233 * fVar54 + fVar226 * fVar272 + fVar219 * fVar61 +
                          fVar241 * fVar87 + fVar249 * fVar93 + fVar257 * fVar100;
            pfVar269[7] = in_register_0000121c;
            pfVar269[8] = fVar279 + fVar41 * fVar191 + fVar198 * fVar27 + fVar206 * fVar34 +
                          fVar227 * fVar55 + fVar220 * fVar273 + fVar213 * fVar74 +
                          fVar235 * fVar94 + fVar243 * fVar101 + fVar251 * fVar108;
            pfVar269[9] = fVar280 + fVar42 * fVar192 + fVar199 * fVar28 + fVar207 * fVar35 +
                          fVar228 * fVar56 + fVar221 * fVar68 + fVar214 * fVar75 +
                          fVar236 * fVar95 + fVar244 * fVar102 + fVar252 * fVar109;
            pfVar269[10] = fVar281 + fVar43 * fVar193 + fVar200 * fVar29 + fVar208 * fVar36 +
                           fVar229 * fVar57 + fVar222 * fVar69 + fVar215 * fVar76 +
                           fVar237 * fVar96 + fVar245 * fVar103 + fVar253 * fVar110;
            pfVar269[0xb] =
                 fVar282 + fVar44 * fVar194 + fVar201 * fVar30 + fVar209 * fVar37 +
                 fVar230 * fVar58 + fVar223 * fVar70 + fVar216 * fVar77 +
                 fVar238 * fVar97 + fVar246 * fVar104 + fVar254 * fVar111;
            pfVar269[0xc] =
                 fVar283 + fVar45 * fVar195 + fVar202 * fVar31 + fVar210 * fVar38 +
                 fVar231 * fVar59 + fVar224 * fVar71 + fVar217 * fVar78 +
                 fVar239 * fVar98 + fVar247 * fVar105 + fVar255 * fVar112;
            pfVar269[0xd] =
                 fVar284 + fVar46 * fVar196 + fVar203 * fVar32 + fVar211 * fVar39 +
                 fVar232 * fVar60 + fVar225 * fVar72 + fVar218 * fVar79 +
                 fVar240 * fVar99 + fVar248 * fVar106 + fVar256 * fVar113;
            pfVar269[0xe] =
                 fVar285 + fVar47 * fVar197 + fVar204 * fVar33 + fVar212 * fVar40 +
                 fVar233 * fVar61 + fVar226 * fVar73 + fVar219 * fVar80 +
                 fVar241 * fVar100 + fVar249 * fVar107 + fVar257 * fVar114;
            pfVar269[0xf] = in_register_0000125c;
            pfVar269 = pfVar269 + 0x10;
            uVar263 = uVar267 + 3;
            uVar267 = uVar267 + 2;
          }
          iVar262 = uVar13 - uVar267;
          if (iVar262 != 0 && (int)uVar267 <= (int)uVar13) {
            lVar260 = 0;
            lVar268 = 0;
            do {
              pfVar11 = (float *)((long)pfVar270 + lVar268 * 2);
              fVar288 = pfVar11[1];
              fVar291 = pfVar11[2];
              fVar16 = pfVar11[3];
              fVar17 = pfVar11[4];
              fVar18 = pfVar11[5];
              fVar19 = pfVar11[6];
              pfVar5 = (float *)((long)pfVar270 + lVar268 * 2 + 0x20);
              fVar20 = pfVar5[1];
              fVar21 = pfVar5[2];
              fVar22 = pfVar5[3];
              fVar23 = pfVar5[4];
              fVar24 = pfVar5[5];
              fVar25 = pfVar5[6];
              pfVar6 = (float *)((long)pfVar270 + lVar268 * 2 + 0x40);
              fVar26 = pfVar6[1];
              fVar27 = pfVar6[2];
              fVar28 = pfVar6[3];
              fVar29 = pfVar6[4];
              fVar30 = pfVar6[5];
              fVar31 = pfVar6[6];
              fVar272 = in_register_0000125c + in_register_0000129c;
              pfVar2 = (float *)((long)pfVar261 + lVar268 * 2);
              fVar32 = pfVar2[1];
              fVar33 = pfVar2[2];
              fVar34 = pfVar2[3];
              fVar35 = pfVar2[4];
              fVar36 = pfVar2[5];
              fVar37 = pfVar2[6];
              pfVar7 = (float *)((long)pfVar261 + lVar268 * 2 + 0x20);
              fVar38 = pfVar7[1];
              fVar39 = pfVar7[2];
              fVar40 = pfVar7[3];
              fVar41 = pfVar7[4];
              fVar42 = pfVar7[5];
              fVar43 = pfVar7[6];
              pfVar8 = (float *)((long)pfVar261 + lVar268 * 2 + 0x40);
              fVar44 = pfVar8[1];
              fVar45 = pfVar8[2];
              fVar46 = pfVar8[3];
              fVar47 = pfVar8[4];
              fVar48 = pfVar8[5];
              fVar49 = pfVar8[6];
              fVar273 = fVar272 + in_register_0000129c + in_register_000012dc;
              pfVar3 = (float *)((long)pfVar264 + lVar268 * 2);
              fVar50 = pfVar3[1];
              fVar51 = pfVar3[2];
              fVar52 = pfVar3[3];
              fVar53 = pfVar3[4];
              fVar54 = pfVar3[5];
              fVar55 = pfVar3[6];
              pfVar9 = (float *)((long)pfVar264 + lVar268 * 2 + 0x20);
              fVar56 = pfVar9[1];
              fVar57 = pfVar9[2];
              fVar58 = pfVar9[3];
              fVar59 = pfVar9[4];
              fVar60 = pfVar9[5];
              fVar61 = pfVar9[6];
              pfVar10 = (float *)((long)pfVar264 + lVar268 * 2 + 0x40);
              fVar62 = pfVar10[1];
              fVar63 = pfVar10[2];
              fVar64 = pfVar10[3];
              fVar65 = pfVar10[4];
              fVar66 = pfVar10[5];
              fVar67 = pfVar10[6];
              in_register_0000125c = in_register_0000129c + fVar273 + in_register_0000129c;
              in_register_0000121c =
                   fVar286 + in_register_0000121c + fVar272 + fVar273 + in_register_0000125c;
              pfVar4 = (float *)((long)pfVar269 + lVar268);
              *pfVar4 = fVar279 + fVar191 * *pfVar11 + fVar198 * *pfVar5 + fVar206 * *pfVar6 +
                        fVar227 * *pfVar2 + fVar220 * *pfVar7 + fVar213 * *pfVar8 +
                        fVar235 * *pfVar3 + fVar243 * *pfVar9 + fVar251 * *pfVar10;
              pfVar4[1] = fVar280 + fVar192 * fVar288 + fVar199 * fVar20 + fVar207 * fVar26 +
                          fVar228 * fVar32 + fVar221 * fVar38 + fVar214 * fVar44 +
                          fVar236 * fVar50 + fVar244 * fVar56 + fVar252 * fVar62;
              pfVar4[2] = fVar281 + fVar193 * fVar291 + fVar200 * fVar21 + fVar208 * fVar27 +
                          fVar229 * fVar33 + fVar222 * fVar39 + fVar215 * fVar45 +
                          fVar237 * fVar51 + fVar245 * fVar57 + fVar253 * fVar63;
              pfVar4[3] = fVar282 + fVar194 * fVar16 + fVar201 * fVar22 + fVar209 * fVar28 +
                          fVar230 * fVar34 + fVar223 * fVar40 + fVar216 * fVar46 +
                          fVar238 * fVar52 + fVar246 * fVar58 + fVar254 * fVar64;
              pfVar4[4] = fVar283 + fVar195 * fVar17 + fVar202 * fVar23 + fVar210 * fVar29 +
                          fVar231 * fVar35 + fVar224 * fVar41 + fVar217 * fVar47 +
                          fVar239 * fVar53 + fVar247 * fVar59 + fVar255 * fVar65;
              pfVar4[5] = fVar284 + fVar196 * fVar18 + fVar203 * fVar24 + fVar211 * fVar30 +
                          fVar232 * fVar36 + fVar225 * fVar42 + fVar218 * fVar48 +
                          fVar240 * fVar54 + fVar248 * fVar60 + fVar256 * fVar66;
              pfVar4[6] = fVar285 + fVar197 * fVar19 + fVar204 * fVar25 + fVar212 * fVar31 +
                          fVar233 * fVar37 + fVar226 * fVar43 + fVar219 * fVar49 +
                          fVar241 * fVar55 + fVar249 * fVar61 + fVar257 * fVar67;
              pfVar4[7] = in_register_0000121c;
              lVar268 = lVar268 + 0x20;
              lVar260 = lVar260 + -0x40;
              iVar262 = iVar262 + -1;
            } while (iVar262 != 0);
            pfVar269 = (float *)((long)pfVar269 + lVar268);
            pfVar270 = (float *)((long)pfVar270 - lVar260);
            pfVar261 = (float *)((long)pfVar261 - lVar260);
            pfVar264 = (float *)((long)pfVar264 - lVar260);
          }
          pfVar270 = pfVar270 + iVar259;
          pfVar261 = pfVar261 + iVar259;
          pfVar264 = pfVar264 + iVar259;
          iVar265 = iVar265 + 1;
        } while (iVar265 != iVar14);
      }
      lVar266 = lVar266 + 1;
    } while (lVar266 != iVar12);
  }
  return;
}

Assistant:

static void convdw3x3s2_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const int tailstep = (w - 2 * outw + w) * 8;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + g * 8) : _mm256_setzero_ps();

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);

        __m256 _k00 = _mm256_load_ps(k0);
        __m256 _k01 = _mm256_load_ps(k0 + 8);
        __m256 _k02 = _mm256_load_ps(k0 + 16);
        __m256 _k10 = _mm256_load_ps(k0 + 24);
        __m256 _k11 = _mm256_load_ps(k0 + 32);
        __m256 _k12 = _mm256_load_ps(k0 + 40);
        __m256 _k20 = _mm256_load_ps(k0 + 48);
        __m256 _k21 = _mm256_load_ps(k0 + 56);
        __m256 _k22 = _mm256_load_ps(k0 + 64);

        int i = 0;
        for (; i < outh; i++)
        {
            int j = 0;
            for (; j + 3 < outw; j += 4)
            {
                __m256 _sum0 = _bias0;
                __m256 _sum1 = _bias0;
                __m256 _sum2 = _bias0;
                __m256 _sum3 = _bias0;

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);
                __m256 _r03 = _mm256_load_ps(r0 + 24);
                __m256 _r04 = _mm256_load_ps(r0 + 32);
                __m256 _r05 = _mm256_load_ps(r0 + 40);
                __m256 _r06 = _mm256_load_ps(r0 + 48);
                __m256 _r07 = _mm256_load_ps(r0 + 56);
                __m256 _r08 = _mm256_load_ps(r0 + 64);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k00, _r02, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k00, _r04, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k00, _r06, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r03, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k01, _r05, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k01, _r07, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r04, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k02, _r06, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k02, _r08, _sum3);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);
                __m256 _r13 = _mm256_load_ps(r1 + 24);
                __m256 _r14 = _mm256_load_ps(r1 + 32);
                __m256 _r15 = _mm256_load_ps(r1 + 40);
                __m256 _r16 = _mm256_load_ps(r1 + 48);
                __m256 _r17 = _mm256_load_ps(r1 + 56);
                __m256 _r18 = _mm256_load_ps(r1 + 64);

                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r12, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k10, _r14, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k10, _r16, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r13, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k11, _r15, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k11, _r17, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r14, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k12, _r16, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k12, _r18, _sum3);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);
                __m256 _r23 = _mm256_load_ps(r2 + 24);
                __m256 _r24 = _mm256_load_ps(r2 + 32);
                __m256 _r25 = _mm256_load_ps(r2 + 40);
                __m256 _r26 = _mm256_load_ps(r2 + 48);
                __m256 _r27 = _mm256_load_ps(r2 + 56);
                __m256 _r28 = _mm256_load_ps(r2 + 64);

                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r22, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k20, _r24, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k20, _r26, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r23, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k21, _r25, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k21, _r27, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r24, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k22, _r26, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k22, _r28, _sum3);

                _mm256_store_ps(outptr0, _sum0);
                _mm256_store_ps(outptr0 + 8, _sum1);
                _mm256_store_ps(outptr0 + 16, _sum2);
                _mm256_store_ps(outptr0 + 24, _sum3);

                r0 += 2 * 32;
                r1 += 2 * 32;
                r2 += 2 * 32;
                outptr0 += 32;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m256 _sum0 = _bias0;
                __m256 _sum1 = _bias0;

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);
                __m256 _r03 = _mm256_load_ps(r0 + 24);
                __m256 _r04 = _mm256_load_ps(r0 + 32);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k00, _r02, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r03, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r04, _sum1);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);
                __m256 _r13 = _mm256_load_ps(r1 + 24);
                __m256 _r14 = _mm256_load_ps(r1 + 32);

                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r12, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r13, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r14, _sum1);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);
                __m256 _r23 = _mm256_load_ps(r2 + 24);
                __m256 _r24 = _mm256_load_ps(r2 + 32);

                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r22, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r23, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r24, _sum1);

                _mm256_store_ps(outptr0, _sum0);
                _mm256_store_ps(outptr0 + 8, _sum1);

                r0 += 2 * 16;
                r1 += 2 * 16;
                r2 += 2 * 16;
                outptr0 += 16;
            }
            for (; j < outw; j++)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                _mm256_store_ps(outptr0, _sum0);

                r0 += 2 * 8;
                r1 += 2 * 8;
                r2 += 2 * 8;
                outptr0 += 8;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}